

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O3

void flatbuffers::tests::ParseProtoBufAsciiTest(void)

{
  bool bVar1;
  uint8_t *flatbuffer;
  char *pcVar2;
  string text;
  Parser parser;
  undefined1 local_aa0 [784];
  Parser local_790;
  
  IDLOptions::IDLOptions((IDLOptions *)local_aa0);
  Parser::Parser(&local_790,(IDLOptions *)local_aa0);
  IDLOptions::~IDLOptions((IDLOptions *)local_aa0);
  local_790.opts.protobuf_ascii_alike = true;
  bVar1 = Parser::Parse(&local_790,"table S { B:int; } table T { A:[int]; C:S; } root_type T;",
                        (char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser.Parse(\"table S { B:int; } table T { A:[int]; C:S; } root_type T;\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x143,"");
  bVar1 = Parser::Parse(&local_790,"{ A [1 2] C { B:2 }}",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parser.Parse(\"{ A [1 2] C { B:2 }}\")\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x144,"");
  local_aa0._8_8_ = 0;
  local_aa0[0x10] = false;
  local_aa0._0_8_ = local_aa0 + 0x10;
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_790.builder_);
  pcVar2 = GenText(&local_790,flatbuffer,(string *)local_aa0);
  TestEq<bool,bool>(true,pcVar2 == (char *)0x0,"\'nullptr\' != \'err\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x14a,"");
  TestEqStr((char *)local_aa0._0_8_,"{\n  A [\n    1\n    2\n  ]\n  C {\n    B: 2\n  }\n}\n",
            "\'text.c_str()\' != \'\"{\\n  A [\\n    1\\n    2\\n  ]\\n  C {\\n    B: 2\\n  }\\n}\\n\"\'"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
            ,0x14c,"");
  if ((undefined1 *)local_aa0._0_8_ != local_aa0 + 0x10) {
    operator_delete((void *)local_aa0._0_8_,CONCAT71(local_aa0._17_7_,local_aa0[0x10]) + 1);
  }
  Parser::~Parser(&local_790);
  return;
}

Assistant:

void ParseProtoBufAsciiTest() {
  // We can put the parser in a mode where it will accept JSON that looks more
  // like Protobuf ASCII, for users that have data in that format.
  // This uses no "" for field names (which we already support by default,
  // omits `,`, `:` before `{` and a couple of other features.
  flatbuffers::Parser parser;
  parser.opts.protobuf_ascii_alike = true;
  TEST_EQ(
      parser.Parse("table S { B:int; } table T { A:[int]; C:S; } root_type T;"),
      true);
  TEST_EQ(parser.Parse("{ A [1 2] C { B:2 }}"), true);
  // Similarly, in text output, it should omit these.
  std::string text;
  auto err =
      flatbuffers::GenText(
      parser, parser.builder_.GetBufferPointer(), &text);
  TEST_NULL(err);
  TEST_EQ_STR(text.c_str(),
              "{\n  A [\n    1\n    2\n  ]\n  C {\n    B: 2\n  }\n}\n");
}